

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O2

bool ON_IsValidKnotVector(int order,int cv_count,double *knot,ON_TextLog *text_logx)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  char *format;
  ulong uVar4;
  ON_TextLog *this;
  
  this = (ON_TextLog *)((ulong)text_logx & 0xfffffffffffffffe);
  if (order < 2) {
    if (this != (ON_TextLog *)0x0) {
      ON_TextLog::Print(this,"Knot vector order = %d (should be >= 2 )\n",(ulong)(uint)order);
    }
  }
  else if (cv_count < order) {
    if (this != (ON_TextLog *)0x0) {
      ON_TextLog::Print(this,"Knot vector cv_count = %d (should be >= order=%d )\n",
                        (ulong)(uint)cv_count,(ulong)(uint)order);
    }
  }
  else if (knot == (double *)0x0) {
    if (this != (ON_TextLog *)0x0) {
      ON_TextLog::Print(this,"Knot vector knot array = nullptr.\n");
    }
  }
  else {
    for (uVar3 = 0; (order + cv_count) - 2 != uVar3; uVar3 = uVar3 + 1) {
      bVar1 = ON_IsValid(knot[uVar3]);
      if (!bVar1) {
        if (this != (ON_TextLog *)0x0) {
          ON_TextLog::Print(this,"Knot vector knot[%d]=%g is not valid.\n",knot[uVar3],
                            uVar3 & 0xffffffff);
        }
        goto joined_r0x004d84ff;
      }
    }
    uVar3 = (ulong)(order - 2);
    uVar4 = (ulong)(order - 1);
    if (knot[uVar4] <= knot[uVar3]) {
      if (this == (ON_TextLog *)0x0) goto joined_r0x004d84ff;
      format = 
      "Knot vector order=%d and knot[%d]=%g >= knot[%d]=%g (should have knot[order-2] < knot[order-1]).\n"
      ;
      uVar2 = (ulong)(uint)order;
    }
    else {
      uVar3 = (ulong)(cv_count - 2);
      uVar4 = (ulong)(cv_count - 1U);
      if (knot[uVar3] < knot[uVar4]) {
        uVar3 = 0;
LAB_004d84a3:
        uVar4 = uVar3;
        if (order + cv_count + -3 != (int)uVar4) goto code_r0x004d84ab;
        uVar3 = 0;
        while( true ) {
          if (cv_count - 1U == (uint)uVar3) {
            return true;
          }
          if (knot[(ulong)(uint)order + (uVar3 - 1)] <= knot[uVar3]) break;
          uVar3 = uVar3 + 1;
        }
        if (this == (ON_TextLog *)0x0) goto joined_r0x004d84ff;
        uVar4 = (ulong)((uint)uVar3 + 1);
        format = "Knot vector order = %d but knot[%d]=%g >= knot[%d]=%g\n";
        uVar2 = (ulong)(uint)order;
        goto LAB_004d853d;
      }
      if (this == (ON_TextLog *)0x0) goto joined_r0x004d84ff;
      format = 
      "Knot vector cv_count=%d and knot[%d]=%g >= knot[%d]=%g (should have knot[cv_count-2] < knot[cv_count-1]).\n"
      ;
      uVar2 = (ulong)(uint)cv_count;
    }
LAB_004d853d:
    ON_TextLog::Print(this,format,uVar2,uVar3,uVar4);
  }
  goto joined_r0x004d84ff;
code_r0x004d84ab:
  uVar3 = uVar4 + 1;
  if (knot[uVar4 + 1] < knot[uVar4]) goto code_r0x004d84c1;
  goto LAB_004d84a3;
code_r0x004d84c1:
  if (this != (ON_TextLog *)0x0) {
    ON_TextLog::Print(this,"Knot vector must be increasing but knot[%d]=%g > knot[%d]=%g\n",
                      uVar4 & 0xffffffff);
  }
joined_r0x004d84ff:
  if (((ulong)text_logx & 1) == 0) {
    bVar1 = ON_IsNotValid();
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_IsValidKnotVector( int order, int cv_count, const double* knot, ON_TextLog* text_logx )
{
  // If low bit of text_log pointer is 1, then ON_Error is not called when the
  // knot vector is invalid.
  const ON__INT_PTR lowbit = 1;
  const ON__INT_PTR hightbits = ~lowbit;
  bool bSilentError = ( 0 != (lowbit & ((ON__INT_PTR)text_logx)) );
  ON_TextLog* text_log = (ON_TextLog*)(((ON__INT_PTR)text_logx) & hightbits);

  const double *k0, *k1;
  int i;
  if ( order < 2 )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector order = %d (should be >= 2 )\n",order);
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }
  if ( cv_count < order )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector cv_count = %d (should be >= order=%d )\n",cv_count,order);
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }
  if ( knot == nullptr )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector knot array = nullptr.\n");
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }

  for ( i = 0; i < cv_count+order-2; i++ )
  {
    if ( !ON_IsValid(knot[i]) )
    {
      if ( text_log )
      {
        text_log->Print("Knot vector knot[%d]=%g is not valid.\n",i,knot[i]);
      }
      return ON_KnotVectorIsNotValid(bSilentError);
    }
  }

  if ( !(knot[order-2] < knot[order-1]) )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector order=%d and knot[%d]=%g >= knot[%d]=%g (should have knot[order-2] < knot[order-1]).\n",
                       order,order-2,knot[order-2],order-1,knot[order-1]);
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }
  if ( !(knot[cv_count-2] < knot[cv_count-1]) )
  {
    if ( text_log )
    {
      text_log->Print("Knot vector cv_count=%d and knot[%d]=%g >= knot[%d]=%g (should have knot[cv_count-2] < knot[cv_count-1]).\n",
                       cv_count,cv_count-2,knot[cv_count-2],cv_count-1,knot[cv_count-1]);
    }
    return ON_KnotVectorIsNotValid(bSilentError);
  }

  // entire array must be monotone increasing
  k0 = knot;
  k1 = knot+1;
  i = order + cv_count - 3;
  while (i--) {
    if ( !(*k1 >= *k0) )
    {
      if ( text_log )
      {
        text_log->Print("Knot vector must be increasing but knot[%d]=%g > knot[%d]=%g\n",
                         order+cv_count-4-i, *k0, order+cv_count-3-i, *k1 );
      }
      return ON_KnotVectorIsNotValid(bSilentError);
    }
    k0++;
    k1++;
  }

  // must have knot[i+order-1] > knot[i]
  k0 = knot;
  k1 = knot + order - 1;
  i = cv_count-1;
  while(i--) {
    if ( !(*k1 > *k0) )
    {
      if ( text_log )
      {
        text_log->Print("Knot vector order = %d but knot[%d]=%g >= knot[%d]=%g\n",
                         order, cv_count-2-i, *k0, cv_count-1-i, *k1 );
      }
      return ON_KnotVectorIsNotValid(bSilentError);
    }
    k0++;
    k1++;
  }

  return true;
}